

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfocusframe.cpp
# Opt level: O2

void __thiscall QFocusFrame::paintEvent(QFocusFrame *this,QPaintEvent *param_1)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  QStyle *pQVar5;
  QWidgetPrivate *this_00;
  long in_FS_OFFSET;
  QRect QVar6;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  QWidget *pQStack_90;
  QStyle *local_88;
  QStyleOption option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(long *)(lVar2 + 600) != 0) {
    local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_90 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter((QStylePainter *)&local_98,&this->super_QWidget);
    option.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    option._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    option.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption(&option,1,0);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&option);
    pQVar5 = QWidget::style(&this->super_QWidget);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x40,&option,this);
    pQVar5 = QWidget::style(&this->super_QWidget);
    iVar4 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x41,&option,this);
    this_00 = qt_widget_private(*(QWidget **)(lVar2 + 600));
    QVar6 = QWidgetPrivate::clipRect(this_00);
    local_a8 = QVar6._0_8_;
    local_a0 = CONCAT44(QVar6.y2.m_i.m_i + iVar3 * 2,QVar6.x2.m_i.m_i + iVar4 * 2);
    QPainter::setClipRect((QRect *)&local_98,(ClipOperation)&local_a8);
    QStylePainter::drawControl((QStylePainter *)&local_98,CE_FocusFrame,&option);
    QStyleOption::~QStyleOption(&option);
    QPainter::~QPainter((QPainter *)&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
QFocusFrame::paintEvent(QPaintEvent *)
{
    Q_D(QFocusFrame);

    if (!d->widget)
        return;

    QStylePainter p(this);
    QStyleOption option;
    initStyleOption(&option);
    const int vmargin = style()->pixelMetric(QStyle::PM_FocusFrameVMargin, &option, this);
    const int hmargin = style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &option, this);
    QWidgetPrivate *wd = qt_widget_private(d->widget);
    QRect rect = wd->clipRect().adjusted(0, 0, hmargin*2, vmargin*2);
    p.setClipRect(rect);
    p.drawControl(QStyle::CE_FocusFrame, option);
}